

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O0

void __thiscall o3dgc::Vector<unsigned_char>::PushBack(Vector<unsigned_char> *this,uchar *value)

{
  uchar uVar1;
  unsigned_long uVar2;
  uchar *__dest;
  uchar *tmp;
  uchar *value_local;
  Vector<unsigned_char> *this_local;
  
  if (this->m_size == this->m_allocated) {
    this->m_allocated = this->m_allocated << 1;
    if (this->m_allocated < 0x20) {
      this->m_allocated = 0x20;
    }
    __dest = (uchar *)operator_new__(this->m_allocated);
    if (this->m_size != 0) {
      memcpy(__dest,this->m_buffer,this->m_size);
      if (this->m_buffer != (uchar *)0x0) {
        operator_delete__(this->m_buffer);
      }
    }
    this->m_buffer = __dest;
  }
  if (this->m_allocated <= this->m_size) {
    __assert_fail("m_size < m_allocated",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcVector.h"
                  ,0x58,"void o3dgc::Vector<unsigned char>::PushBack(const T &) [T = unsigned char]"
                 );
  }
  uVar1 = *value;
  uVar2 = this->m_size;
  this->m_size = uVar2 + 1;
  this->m_buffer[uVar2] = uVar1;
  return;
}

Assistant:

void                    PushBack(const T & value)
                                {
                                    if (m_size == m_allocated)
                                    {
                                        m_allocated *= 2;
                                        if (m_allocated < O3DGC_DEFAULT_VECTOR_SIZE)
                                        {
                                            m_allocated = O3DGC_DEFAULT_VECTOR_SIZE;
                                        }
                                        T * tmp      = new T [m_allocated];
                                        if (m_size > 0)
                                        {
                                            memcpy(tmp, m_buffer, m_size * sizeof(T) );
                                            delete [] m_buffer;
                                        }
                                        m_buffer = tmp;
                                    }
                                    assert(m_size < m_allocated);
                                    m_buffer[m_size++] = value;
                                }